

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermUnary * __thiscall
glslang::TIntermediate::addUnaryNode
          (TIntermediate *this,TOperator op,TIntermTyped *child,TSourceLoc *loc)

{
  int iVar1;
  TPoolAllocator *this_00;
  TIntermUnary *this_01;
  undefined4 extraout_var;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TIntermUnary *)TPoolAllocator::allocate(this_00,0xf8);
  TIntermTyped::TIntermTyped((TIntermTyped *)this_01,EbtFloat);
  (this_01->super_TIntermOperator).op = op;
  (this_01->super_TIntermOperator).operationPrecision = EpqNone;
  (this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_00b0fa28;
  this_01->operand = (TIntermTyped *)0x0;
  TSpirvInstruction::TSpirvInstruction(&this_01->spirvInst);
  if (loc->line == 0) {
    iVar1 = (**(child->super_TIntermNode)._vptr_TIntermNode)(child);
    loc = (TSourceLoc *)CONCAT44(extraout_var,iVar1);
  }
  (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (this_01,loc);
  (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x30])
            (this_01,child);
  return this_01;
}

Assistant:

TIntermUnary* TIntermediate::addUnaryNode(TOperator op, TIntermTyped* child, const TSourceLoc& loc) const
{
    TIntermUnary* node = new TIntermUnary(op);
    node->setLoc(loc.line != 0 ? loc : child->getLoc());
    node->setOperand(child);

    return node;
}